

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall PrintStatement::evaluate(PrintStatement *this,SymTab *symTab)

{
  bool bVar1;
  int iVar2;
  Testlist *this_00;
  reference ppEVar3;
  undefined4 extraout_var;
  types *ptVar4;
  ostream *poVar5;
  reference ppTVar6;
  ulong uVar7;
  size_type sVar8;
  double dVar9;
  string local_118;
  int local_f8;
  int local_f4;
  int i_1;
  int i;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  undefined1 local_a8 [8];
  TypeDescriptor typeDescriptor;
  ExprNode *exprNode;
  iterator __end1;
  iterator __begin1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> *__range1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> testlist;
  SymTab *symTab_local;
  PrintStatement *this_local;
  
  testlist.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)symTab;
  this_00 = testList(this);
  Testlist::getTestlist((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1,this_00);
  __end1 = std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::begin
                     ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1);
  exprNode = (ExprNode *)
             std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::end
                       ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ExprNode_**,_std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>_>
                                     *)&exprNode), bVar1) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<ExprNode_**,_std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>_>
              ::operator*(&__end1);
    typeDescriptor._80_8_ = *ppEVar3;
    iVar2 = (*((ExprNode *)typeDescriptor._80_8_)->_vptr_ExprNode[1])
                      (typeDescriptor._80_8_,
                       testlist.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    TypeDescriptor::TypeDescriptor
              ((TypeDescriptor *)local_a8,(TypeDescriptor *)CONCAT44(extraout_var,iVar2));
    ptVar4 = TypeDescriptor::type((TypeDescriptor *)local_a8);
    if (*ptVar4 == NUMBER) {
      dVar9 = TypeDescriptor::getNumber((TypeDescriptor *)local_a8);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar9);
      poVar5 = std::operator<<(poVar5," ");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      ptVar4 = TypeDescriptor::type((TypeDescriptor *)local_a8);
      if (*ptVar4 == STRING) {
        TypeDescriptor::getString_abi_cxx11_
                  ((string *)
                   &array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(TypeDescriptor *)local_a8);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 &array.
                                  super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar5 = std::operator<<(poVar5," ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string
                  ((string *)
                   &array.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        TypeDescriptor::getArray
                  ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1,
                   (TypeDescriptor *)local_a8);
        std::operator<<((ostream *)&std::cout,"[");
        ppTVar6 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::operator[]
                            ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1,0);
        ptVar4 = TypeDescriptor::type(*ppTVar6);
        if (*ptVar4 == NUMBER) {
          for (local_f4 = 0; uVar7 = (ulong)local_f4,
              sVar8 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::size
                                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1
                                ), uVar7 < sVar8; local_f4 = local_f4 + 1) {
            if (local_f4 != 0) {
              std::operator<<((ostream *)&std::cout,", ");
            }
            ppTVar6 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::operator[]
                                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1
                                 ,(long)local_f4);
            dVar9 = TypeDescriptor::getNumber(*ppTVar6);
            std::ostream::operator<<((ostream *)&std::cout,dVar9);
          }
        }
        else {
          for (local_f8 = 0; uVar7 = (ulong)local_f8,
              sVar8 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::size
                                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1
                                ), uVar7 < sVar8; local_f8 = local_f8 + 1) {
            if (local_f8 != 0) {
              std::operator<<((ostream *)&std::cout,", ");
            }
            ppTVar6 = std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::operator[]
                                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1
                                 ,(long)local_f8);
            TypeDescriptor::getString_abi_cxx11_(&local_118,*ppTVar6);
            std::operator<<((ostream *)&std::cout,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
          }
        }
        std::operator<<((ostream *)&std::cout,"]");
        std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~vector
                  ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&i_1);
      }
    }
    TypeDescriptor::~TypeDescriptor((TypeDescriptor *)local_a8);
    __gnu_cxx::__normal_iterator<ExprNode_**,_std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::~vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&__range1);
  return;
}

Assistant:

void PrintStatement::evaluate(SymTab &symTab) {
    //std::cout << "----PRINT-START---- \n";
    std::vector<ExprNode*>testlist = testList()->getTestlist();
    for (ExprNode *exprNode : testlist) {
        TypeDescriptor typeDescriptor = *exprNode->evaluate(symTab);
        if(typeDescriptor.type() == TypeDescriptor::NUMBER)
            std::cout << typeDescriptor.getNumber() << " " << std::endl;
        else if(typeDescriptor.type() == TypeDescriptor::STRING)
            std::cout << typeDescriptor.getString() << " " << std::endl;
        else { //ARRAY
            std::vector<TypeDescriptor*>array = typeDescriptor.getArray();
            std::cout << "[";
            if(array[0]->type() == TypeDescriptor::NUMBER) {
                for (int i = 0; i < array.size(); i++) {
                    if(i != 0) std::cout << ", ";
                    std::cout << array[i]->getNumber();
                }
            } else{ // String Elements
                for (int i = 0; i < array.size(); i++) {
                    if(i != 0) std::cout << ", ";
                    std::cout << array[i]->getString();
                }
            }
            std::cout << "]";//<< std::endl;
        }
    }
    //std::cout << "-----PRINT-END----- \n";
}